

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::minimize_tag>
::sort(storage<baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::itm::minimize_tag> *this)

{
  int *args;
  int iVar1;
  pointer prVar2;
  char *in_R8;
  string_view fmt;
  string_view fmt_00;
  unsigned_long *args_4;
  int local_44;
  m_indices_writer lock;
  
  std::unique_lock<std::shared_mutex>::unique_lock(&lock,&this->m_indices_mutex);
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::storage<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>::sort()::_lambda(int,int)_1_>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_itm_optimizer_common_hpp:429:55)>
              )this);
  fmt._M_str = in_R8;
  fmt._M_len = (size_t)"- Solutions init population:\n";
  to_log<>(_stdout,(FILE *)0x3,0x1d,fmt);
  args_4 = (unsigned_long *)0x2a;
  for (local_44 = 0; local_44 != this->m_size; local_44 = local_44 + 1) {
    prVar2 = (this->m_data).
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    args = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + local_44;
    iVar1 = *args;
    fmt_00._M_str = (char *)&local_44;
    fmt_00._M_len = (size_t)"- {} id {} value {} constraint {} hash {}\n";
    to_log<int,int,double,int,unsigned_long>
              (_stdout,(FILE *)0x5,0x2a,fmt_00,args,(int *)&prVar2[iVar1].value,
               (double *)&prVar2[iVar1].remaining_constraints,(int *)&prVar2[iVar1].hash,args_4);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void sort() noexcept
    {
        m_indices_writer lock{ m_indices_mutex };

        std::sort(
          std::begin(m_indices), std::end(m_indices), [this](int i1, int i2) {
              const int cst_1 = this->m_data[i1].remaining_constraints;
              const int cst_2 = this->m_data[i2].remaining_constraints;
              const double value_1 = this->m_data[i1].value;
              const double value_2 = this->m_data[i2].value;

              if (cst_1 < cst_2)
                  return true;

              if (cst_1 == cst_2)
                  return is_better_solution<Mode>(value_1, value_2);

              return false;
          });

#ifdef BARYONYX_ENABLE_DEBUG
        to_log(stdout, 3u, "- Solutions init population:\n");
        for (int i = 0; i != m_size; ++i) {
            to_log(stdout,
                   5u,
                   "- {} id {} value {} constraint {} hash {}\n",
                   i,
                   m_indices[i],
                   m_data[m_indices[i]].value,
                   m_data[m_indices[i]].remaining_constraints,
                   m_data[m_indices[i]].hash);
        }
#endif
    }